

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_item_t_conflict
new_func_arr(MIR_context_t ctx,char *name,size_t nres,MIR_type_t *res_types,size_t nargs,
            int vararg_p,MIR_var_t *vars)

{
  long lVar1;
  MIR_type_t MVar2;
  MIR_reg_t MVar3;
  size_t sVar4;
  MIR_item_t_conflict pMVar5;
  MIR_func_t func;
  char *pcVar6;
  MIR_item_t_conflict pMVar7;
  VARR_MIR_var_t *pVVar8;
  MIR_var_t *pMVar9;
  _func_void_size_t_void_ptr *free_func;
  undefined8 *puVar10;
  undefined8 *puVar11;
  ulong uVar12;
  MIR_var_t *pMVar13;
  size_t sVar14;
  MIR_type_t *res_types_00;
  size_t nres_00;
  char **ppcVar15;
  MIR_error_type_t MVar16;
  char *message;
  MIR_context_t ctx_00;
  MIR_type_t type;
  undefined4 in_register_0000008c;
  ulong uVar17;
  char *stored_name;
  char **in_stack_ffffffffffffff90;
  char *local_50;
  undefined8 local_48;
  char *pcStack_40;
  size_t local_38;
  
  pMVar13 = (MIR_var_t *)CONCAT44(in_register_0000008c,vararg_p);
  if (ctx->curr_func == (MIR_func_t)0x0) {
    if (nargs == 0 && vararg_p != 0) {
      pcVar6 = "Variable arg function %s w/o any mandatory argument";
      MVar16 = MIR_vararg_func_error;
    }
    else {
      if (nres != 0) {
        sVar4 = 0;
        do {
          if (MIR_T_P < res_types[sVar4]) {
            pcVar6 = "wrong result type in func %s";
            MVar16 = MIR_wrong_type_error;
            goto LAB_00131b91;
          }
          sVar4 = sVar4 + 1;
        } while (nres != sVar4);
      }
      sVar4 = nargs;
      pMVar5 = create_item(ctx,MIR_func_item,"function");
      func = (MIR_func_t)malloc(nres * 4 + 0x88);
      (pMVar5->u).func = func;
      ctx->curr_func = func;
      if (func != (MIR_func_t)0x0) {
        pcVar6 = get_ctx_str(ctx,name);
        func->name = pcVar6;
        func->func_item = pMVar5;
        func->nres = (uint32_t)nres;
        func->res_types = (MIR_type_t *)(func + 1);
        if (nres != 0) {
          memcpy(func + 1,res_types,nres << 2);
        }
        pcVar6 = (char *)pMVar5;
        pMVar7 = add_item(ctx,pMVar5);
        if (pMVar7 != pMVar5) {
          __assert_fail("tab_item == func_item",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x569,
                        "MIR_item_t new_func_arr(MIR_context_t, const char *, size_t, MIR_type_t *, size_t, int, MIR_var_t *)"
                       );
        }
        message = &DAT_00000018;
        pVVar8 = (VARR_MIR_var_t *)malloc(0x18);
        (func->insns).head = (MIR_insn_t_conflict)0x0;
        (func->insns).tail = (MIR_insn_t_conflict)0x0;
        (func->original_insns).head = (MIR_insn_t_conflict)0x0;
        (func->original_insns).tail = (MIR_insn_t_conflict)0x0;
        func->vars = pVVar8;
        if (pVVar8 != (VARR_MIR_var_t *)0x0) {
          sVar14 = 0x40;
          if (nargs + 8 != 0) {
            sVar14 = nargs + 8;
          }
          pVVar8->els_num = 0;
          pVVar8->size = sVar14;
          res_types_00 = (MIR_type_t *)(sVar14 * 8);
          pMVar9 = (MIR_var_t *)malloc(sVar14 * 0x18);
          pVVar8->varr = pMVar9;
          func->global_vars = (VARR_MIR_var_t *)0x0;
          func->nargs = (uint32_t)nargs;
          func->last_temp_num = 0;
          func->n_inlines = 0;
          func->vararg_p = vararg_p != 0;
          func->expr_p = '\0';
          func->jret_p = '\0';
          func->first_lref = (MIR_lref_data *)0x0;
          free_func = (_func_void_size_t_void_ptr *)malloc(0x20);
          func->machine_code = (void *)0x0;
          func->call_addr = (void *)0x0;
          func->internal = free_func;
          if (free_func == (_func_void_size_t_void_ptr *)0x0) {
            pcVar6 = "Not enough memory for func regs info";
            ctx_00 = (MIR_context_t)0x3;
            (*ctx->error_func)(MIR_alloc_error,"Not enough memory for func regs info");
          }
          else {
            message = &DAT_00000018;
            puVar10 = (undefined8 *)malloc(0x18);
            *(undefined8 **)free_func = puVar10;
            if (puVar10 == (undefined8 *)0x0) goto LAB_00131bbb;
            *puVar10 = 0;
            puVar10[1] = 0x32;
            ctx_00 = (MIR_context_t)0x4b0;
            puVar11 = (undefined8 *)malloc(0x4b0);
            puVar10[2] = puVar11;
            if (puVar11 != (undefined8 *)0x0) {
              *puVar10 = 1;
              puVar11[2] = 0;
              *puVar11 = 6;
              puVar11[1] = 0;
              HTAB_size_t_create((HTAB_size_t **)(free_func + 8),100,name2rdn_hash,name2rdn_eq,
                                 free_func,pMVar13);
              HTAB_size_t_create((HTAB_size_t **)(free_func + 0x10),10,hrn2rdn_hash,hrn2rdn_eq,
                                 free_func,pMVar13);
              HTAB_size_t_create((HTAB_size_t **)(free_func + 0x18),100,reg2rdn_hash,reg2rdn_eq,
                                 free_func,pMVar13);
              if (nargs != 0) {
                ppcVar15 = &vars->name;
                uVar17 = 1;
                do {
                  MVar2 = ((MIR_var_t *)(ppcVar15 + -1))->type;
                  type = MIR_T_I64;
                  if ((MVar2 & ~MIR_T_U8) == MIR_T_F) {
                    type = MVar2;
                  }
                  if (MVar2 == MIR_T_LD) {
                    type = MVar2;
                  }
                  MVar3 = create_func_reg(ctx,func,*ppcVar15,(char *)0x0,(MIR_reg_t)uVar17,type,
                                          (int)&local_50,in_stack_ffffffffffffff90);
                  if (uVar17 != MVar3) goto LAB_00131b9c;
                  *ppcVar15 = local_50;
                  pVVar8 = func->vars;
                  local_38 = (size_t)ppcVar15[1];
                  local_48 = *(undefined8 *)(ppcVar15 + -1);
                  pcStack_40 = *ppcVar15;
                  if (pVVar8->varr == (MIR_var_t *)0x0) goto LAB_00131b97;
                  uVar12 = pVVar8->els_num + 1;
                  if (pVVar8->size < uVar12) {
                    sVar4 = (uVar12 >> 1) + uVar12;
                    pMVar13 = (MIR_var_t *)realloc(pVVar8->varr,sVar4 * 0x18);
                    pVVar8->varr = pMVar13;
                    pVVar8->size = sVar4;
                  }
                  sVar4 = pVVar8->els_num;
                  pMVar13 = pVVar8->varr;
                  pVVar8->els_num = sVar4 + 1;
                  pMVar13[sVar4].size = local_38;
                  pMVar13 = pMVar13 + sVar4;
                  *(undefined8 *)pMVar13 = local_48;
                  pMVar13->name = pcStack_40;
                  lVar1 = (1 - nargs) + uVar17;
                  uVar17 = uVar17 + 1;
                  ppcVar15 = ppcVar15 + 3;
                } while (lVar1 != 1);
              }
              return pMVar5;
            }
          }
          new_func_arr_cold_2();
          pMVar5 = new_func_arr(ctx_00,pcVar6,nres_00,res_types_00,sVar4,1,pMVar13);
          return pMVar5;
        }
LAB_00131bbb:
        mir_varr_error(message);
      }
      free(pMVar5);
      pcVar6 = "Not enough memory for creation of func %s";
      MVar16 = MIR_alloc_error;
    }
  }
  else {
    name = ctx->curr_func->name;
    pcVar6 = "Creating function when previous function %s is not finished";
    MVar16 = MIR_nested_func_error;
  }
LAB_00131b91:
  (*ctx->error_func)(MVar16,pcVar6,name);
LAB_00131b97:
  new_func_arr_cold_1();
LAB_00131b9c:
  __assert_fail("i + 1 == reg",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x57d,
                "MIR_item_t new_func_arr(MIR_context_t, const char *, size_t, MIR_type_t *, size_t, int, MIR_var_t *)"
               );
}

Assistant:

static MIR_item_t new_func_arr (MIR_context_t ctx, const char *name, size_t nres,
                                MIR_type_t *res_types, size_t nargs, int vararg_p,
                                MIR_var_t *vars) {
  MIR_item_t func_item, tab_item;
  MIR_func_t func;

  if (curr_func != NULL)
    MIR_get_error_func (ctx) (MIR_nested_func_error,
                              "Creating function when previous function %s is not finished",
                              curr_func->name);
  if (nargs == 0 && vararg_p)
    MIR_get_error_func (ctx) (MIR_vararg_func_error,
                              "Variable arg function %s w/o any mandatory argument", name);
  for (size_t i = 0; i < nres; i++)
    if (wrong_type_p (res_types[i]))
      MIR_get_error_func (ctx) (MIR_wrong_type_error, "wrong result type in func %s", name);
  func_item = create_item (ctx, MIR_func_item, "function");
  curr_func = func_item->u.func = func
    = malloc (sizeof (struct MIR_func) + nres * sizeof (MIR_type_t));
  if (func == NULL) {
    free (func_item);
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory for creation of func %s", name);
  }
  func->name = get_ctx_str (ctx, name);
  func->func_item = func_item;
  func->nres = (uint32_t) nres;
  func->res_types = (MIR_type_t *) ((char *) func + sizeof (struct MIR_func));
  for (size_t i = 0; i < nres; i++) func->res_types[i] = canon_type (res_types[i]);
  tab_item = add_item (ctx, func_item);
  mir_assert (tab_item == func_item);
  DLIST_INIT (MIR_insn_t, func->insns);
  DLIST_INIT (MIR_insn_t, func->original_insns);
  VARR_CREATE (MIR_var_t, func->vars, nargs + 8);
  func->global_vars = NULL;
  func->nargs = (uint32_t) nargs;
  func->last_temp_num = 0;
  func->vararg_p = vararg_p != 0;
  func->expr_p = func->jret_p = FALSE;
  func->n_inlines = 0;
  func->machine_code = func->call_addr = NULL;
  func->first_lref = NULL;
  func_regs_init (ctx, func);
  for (size_t i = 0; i < nargs; i++) {
    char *stored_name;
    MIR_type_t type = canon_type (vars[i].type);
    MIR_reg_t reg
      = create_func_reg (ctx, func, vars[i].name, NULL, (MIR_reg_t) (i + 1),
                         type == MIR_T_F || type == MIR_T_D || type == MIR_T_LD ? type : MIR_T_I64,
                         FALSE, &stored_name);
    mir_assert (i + 1 == reg);
    vars[i].name = stored_name;
    VARR_PUSH (MIR_var_t, func->vars, vars[i]);
  }
  return func_item;
}